

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeOneofFields
          (MessageGenerator *this,Printer *printer,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields)

{
  FieldDescriptor *pFVar1;
  LogMessage *other;
  pointer ppFVar2;
  long lVar3;
  FieldGenerator *pFVar4;
  pointer ppFVar5;
  LogFinisher local_a9;
  Printer *local_a8;
  Formatter format;
  LogMessage local_68;
  
  local_a8 = printer;
  format.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&format.vars_._M_t,&(this->variables_)._M_t);
  ppFVar2 = (fields->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppFVar5 = (fields->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar2 == ppFVar5) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
               ,0xed0);
    other = internal::LogMessage::operator<<(&local_68,"CHECK failed: !fields.empty(): ");
    internal::LogFinisher::operator=(&local_a9,other);
    internal::LogMessage::~LogMessage(&local_68);
    ppFVar2 = (fields->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppFVar5 = (fields->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  }
  pFVar1 = *ppFVar2;
  if ((long)ppFVar5 - (long)ppFVar2 == 8) {
    GenerateSerializeOneField(this,local_a8,pFVar1,-1);
  }
  else {
    if (((byte)pFVar1[1] & 0x10) == 0) {
      lVar3 = 0;
    }
    else {
      lVar3 = *(long *)(pFVar1 + 0x28);
    }
    Formatter::operator()
              (&format,"switch ($1$_case()) {\n",
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(lVar3 + 8));
    io::Printer::Indent(format.printer_);
    ppFVar5 = (fields->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (ppFVar2 = (fields->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start; ppFVar2 != ppFVar5;
        ppFVar2 = ppFVar2 + 1) {
      pFVar1 = *ppFVar2;
      UnderscoresToCamelCase((string *)&local_68,*(string **)(pFVar1 + 8),true);
      Formatter::operator()
                (&format,"case k$1$: {\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      io::Printer::Indent(format.printer_);
      pFVar4 = FieldGeneratorMap::get(&this->field_generators_,pFVar1);
      (*pFVar4->_vptr_FieldGenerator[0x13])(pFVar4,local_a8);
      Formatter::operator()<>(&format,"break;\n");
      io::Printer::Outdent(format.printer_);
      Formatter::operator()<>(&format,"}\n");
    }
    io::Printer::Outdent(format.printer_);
    Formatter::operator()<>(&format,"  default: ;\n}\n");
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&format.vars_._M_t);
  return;
}

Assistant:

void MessageGenerator::GenerateSerializeOneofFields(
    io::Printer* printer, const std::vector<const FieldDescriptor*>& fields) {
  Formatter format(printer, variables_);
  GOOGLE_CHECK(!fields.empty());
  if (fields.size() == 1) {
    GenerateSerializeOneField(printer, fields[0], -1);
    return;
  }
  // We have multiple mutually exclusive choices.  Emit a switch statement.
  const OneofDescriptor* oneof = fields[0]->containing_oneof();
  format("switch ($1$_case()) {\n", oneof->name());
  format.Indent();
  for (auto field : fields) {
    format("case k$1$: {\n", UnderscoresToCamelCase(field->name(), true));
    format.Indent();
    field_generators_.get(field).GenerateSerializeWithCachedSizesToArray(
        printer);
    format("break;\n");
    format.Outdent();
    format("}\n");
  }
  format.Outdent();
  // Doing nothing is an option.
  format(
      "  default: ;\n"
      "}\n");
}